

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void idx2::Resize<unsigned_long>(array<unsigned_long> *Array,i64 NewSize)

{
  byte *pbVar1;
  byte *pbVar2;
  long lVar3;
  
  if (Array->Capacity < NewSize) {
    GrowCapacity<unsigned_long>(Array,NewSize);
  }
  if (Array->Size < NewSize) {
    pbVar2 = (Array->Buffer).Data;
    for (lVar3 = Array->Size << 3; NewSize * 8 - lVar3 != 0; lVar3 = lVar3 + 8) {
      pbVar1 = pbVar2 + lVar3;
      pbVar1[0] = '\0';
      pbVar1[1] = '\0';
      pbVar1[2] = '\0';
      pbVar1[3] = '\0';
      pbVar1[4] = '\0';
      pbVar1[5] = '\0';
      pbVar1[6] = '\0';
      pbVar1[7] = '\0';
    }
  }
  Array->Size = NewSize;
  return;
}

Assistant:

void
Resize(array<t>* Array, i64 NewSize)
{
  if (NewSize > Array->Capacity) // TODO: maybe grow the capacity until this is false
    GrowCapacity(Array, NewSize);
  if (Array->Size < NewSize)
    Fill(Begin(*Array) + Array->Size, Begin(*Array) + NewSize, t{});
  Array->Size = NewSize;
}